

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O0

Node * __thiscall Node::OutputInteger_abi_cxx11_(Node *this)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  long in_RSI;
  int local_20;
  char ch;
  int Ptr;
  int OFlag;
  Node *this_local;
  string *result;
  
  bVar2 = false;
  local_20 = 0;
  std::__cxx11::string::string((string *)this);
  while( true ) {
    pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI + 8);
    cVar1 = *pcVar3;
    uVar4 = std::__cxx11::string::length();
    if (uVar4 <= (ulong)(long)local_20) break;
    local_20 = local_20 + 1;
    if (cVar1 == '0') {
      if (bVar2) {
        std::__cxx11::string::operator+=((string *)this,'0');
      }
    }
    else if (cVar1 != '%') {
      if ((cVar1 == '.') && (!bVar2)) {
        std::__cxx11::string::operator+=((string *)this,'0');
      }
      std::__cxx11::string::operator+=((string *)this,cVar1);
      bVar2 = true;
    }
  }
  if (!bVar2) {
    std::__cxx11::string::operator+=((string *)this,'0');
  }
  return this;
}

Assistant:

std::string Node::OutputInteger(void)
{
	int OFlag = 0;		// Have we output something yet?
	int Ptr = 0;		// What character are we looking at
	char ch;		// Actual character
	std::string result;		// Working string

	//
	// Output all digits in the string
	//
	while ((ch = TextValue[Ptr]), (Ptr < TextValue.length()))
	{
		Ptr++;
		if (ch == '0')
		{
			if (OFlag != 0)
			{
				result += ch;
			}
		}
		else
		{
			if (ch != '%')
			{
				if ((ch == '.') && (OFlag == 0))
				{
					result += '0';
				}
				result += ch;
				OFlag = 1;
			}
		}
	}

	//
	// If we didn't output anything, then output a zero
	// because it must have been all zeros.
	//
	if (OFlag == 0)
	{
		result += '0';
	}

	return result;
}